

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestValidations::RegisterParserTestValidations(RegisterParserTestValidations *this)

{
  RegisterParserTestValidations *this_local;
  
  RegisterTest(ParserTestValidations::Create,"ParserTest.Validations");
  return;
}

Assistant:

TEST_F(ParserTest, Validations) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build foo: cat bar |@ baz\n"));

  Edge* edge = state.LookupNode("foo")->in_edge();
  ASSERT_EQ(edge->validations_.size(), 1);
  EXPECT_EQ(edge->validations_[0]->path(), "baz");
}